

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_status_code_from_enum.hpp
# Opt level: O3

bool __thiscall
system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent
          (_quick_status_code_from_enum_domain<another_namespace::AnotherCode> *this,
          status_code<void> *code1,status_code<void> *code2)

{
  unique_id_type uVar1;
  unique_id_type uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  uVar1 = code1->_domain->_id;
  if (uVar1 != (this->super_status_code_domain)._id) {
    __assert_fail("code1.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/quick_status_code_from_enum.hpp"
                  ,0x8f,
                  "virtual bool system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent(const status_code<void> &, const status_code<void> &) const [Enum = another_namespace::AnotherCode]"
                 );
  }
  uVar2 = code2->_domain->_id;
  if (uVar2 == uVar1) {
    bVar5 = code1[1]._domain == code2[1]._domain;
  }
  else {
    if (uVar2 == 0x746d6354f4f733e9) {
      lVar3 = 0;
      while (*(status_code_domain **)
              ((long)&quick_status_code_from_enum<another_namespace::AnotherCode>::value_mappings()
                      ::v + lVar3) != code1[1]._domain) {
        lVar3 = lVar3 + 0x20;
        if (lVar3 == 0x80) {
          __assert_fail("mapping != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/quick_status_code_from_enum.hpp"
                        ,0x9b,
                        "virtual bool system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent(const status_code<void> &, const status_code<void> &) const [Enum = another_namespace::AnotherCode]"
                       );
        }
      }
      if (*(long *)(&UNK_0010ebd8 + lVar3) != 0) {
        lVar4 = 0;
        do {
          bVar5 = *(int *)(*(long *)((long)&
                                           PTR__ZGRZN13system_error227quick_status_code_from_enumIN17another_namespace11AnotherCodeEE14value_mappingsEvE1v0__0010ebd0
                                    + lVar3) + lVar4) == *(int *)&code2[1]._domain;
          if (bVar5) {
            return bVar5;
          }
          bVar6 = *(long *)(&UNK_0010ebd8 + lVar3) * 4 + -4 != lVar4;
          lVar4 = lVar4 + 4;
        } while (bVar6);
        return bVar5;
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

virtual bool _do_equivalent(const status_code<void> &code1, const status_code<void> &code2) const noexcept override
  {
    assert(code1.domain() == *this);                                                            // NOLINT
    const auto &c1 = static_cast<const quick_status_code_from_enum_code<value_type> &>(code1);  // NOLINT
    if(code2.domain() == *this)
    {
      const auto &c2 = static_cast<const quick_status_code_from_enum_code<value_type> &>(code2);  // NOLINT
      return c1.value() == c2.value();
    }
    if(code2.domain() == generic_code_domain)
    {
      const auto &c2 = static_cast<const generic_code &>(code2);  // NOLINT
      const auto *mapping = _find_mapping(c1.value());
#if SYSTEM_ERROR2_QUICK_STATUS_CODE_FROM_ENUM_ASSERT_ON_MISSING_MAPPING_TABLE_ENTRIES
      assert(mapping != nullptr);  // if this fires, you forgot to add the enum to the mapping table
#endif
      if(mapping != nullptr)
      {
        for(errc ec : mapping->code_mappings)
        {
          if(ec == c2.value())
          {
            return true;
          }
        }
      }
    }
    return false;
  }